

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.c
# Opt level: O0

int quantize_segment_get(uint32_t field,void *value,mixed_segment *segment)

{
  quantize_segment_data *data;
  mixed_segment *segment_local;
  void *value_local;
  uint32_t field_local;
  
  if (field == 1) {
    *(bool *)value = segment->mix == quantize_segment_mix_bypass;
  }
  else if (field == 0x28) {
    *(int *)value = (int)(long)*(float *)((long)segment->data + 0x10);
  }
  else {
    if (field != 0x29) {
      mixed_err(7);
      return 0;
    }
    *(undefined4 *)value = *(undefined4 *)((long)segment->data + 0x14);
  }
  return 1;
}

Assistant:

int quantize_segment_get(uint32_t field, void *value, struct mixed_segment *segment){
  struct quantize_segment_data *data = (struct quantize_segment_data *)segment->data;
  switch(field){
  case MIXED_MIX: *((float *)value) = data->mix; break;
  case MIXED_BYPASS: *((bool *)value) = (segment->mix == quantize_segment_mix_bypass); break;
  case MIXED_QUANTIZE_STEPS: *((uint32_t *)value) = (uint32_t)data->steps; break;
  default: mixed_err(MIXED_INVALID_FIELD); return 0;
  }
  return 1;
}